

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_llwp(DisasContext_conflict6 *ctx,uint32_t base,int16_t offset,uint32_t reg1,uint32_t reg2)

{
  TCGContext_conflict6 *s;
  TCGTemp *a1;
  TCGTemp *a1_00;
  TCGTemp *a2;
  TCGTemp *a2_00;
  int iVar1;
  undefined6 in_register_00000012;
  uintptr_t o_1;
  TCGv_i64 lo;
  uintptr_t o_4;
  TCGv_i64 val;
  uintptr_t o_5;
  TCGv_i64 addr;
  uintptr_t o_3;
  TCGv_i64 hi;
  
  iVar1 = (int)CONCAT62(in_register_00000012,offset);
  s = ctx->uc->tcg_ctx;
  a1 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
  addr = (TCGv_i64)((long)a1 - (long)s);
  a1_00 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
  val = (TCGv_i64)((long)a1_00 - (long)s);
  a2 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
  lo = (TCGv_i64)((long)a2 - (long)s);
  a2_00 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
  hi = (TCGv_i64)((long)a2_00 - (long)s);
  gen_base_offset_addr(ctx,addr,base,0);
  tcg_gen_qemu_ld_i64_mips64el(s,val,addr,(long)ctx->mem_idx,MO_64);
  tcg_gen_extr32_i64_mips64el(s,lo,hi,val);
  if ((iVar1 != 0) && (s->cpu_gpr[iVar1] != lo)) {
    tcg_gen_op2_mips64el(s,INDEX_op_mov_i64,(TCGArg)(s->cpu_gpr[iVar1] + (long)s),(TCGArg)a2);
  }
  tcg_temp_free_internal_mips64el(s,(TCGTemp *)(lo + (long)s));
  if ((reg1 != 0) && (s->cpu_gpr[(int)reg1] != hi)) {
    tcg_gen_op2_mips64el(s,INDEX_op_mov_i64,(TCGArg)(s->cpu_gpr[(int)reg1] + (long)s),(TCGArg)a2_00)
    ;
  }
  tcg_temp_free_internal_mips64el(s,(TCGTemp *)(hi + (long)s));
  tcg_gen_op3_mips64el(s,INDEX_op_st_i64,(TCGArg)a1_00,(TCGArg)(s->cpu_env + (long)s),0x790);
  tcg_temp_free_internal_mips64el(s,(TCGTemp *)(val + (long)s));
  tcg_gen_op3_mips64el(s,INDEX_op_st_i64,(TCGArg)a1,(TCGArg)(s->cpu_env + (long)s),0x780);
  tcg_temp_free_internal_mips64el(s,(TCGTemp *)(addr + (long)s));
  return;
}

Assistant:

static void gen_llwp(DisasContext *ctx, uint32_t base, int16_t offset,
                    uint32_t reg1, uint32_t reg2)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv taddr = tcg_temp_new(tcg_ctx);
    TCGv_i64 tval = tcg_temp_new_i64(tcg_ctx);
    TCGv tmp1 = tcg_temp_new(tcg_ctx);
    TCGv tmp2 = tcg_temp_new(tcg_ctx);

    gen_base_offset_addr(ctx, taddr, base, offset);
    tcg_gen_qemu_ld64(tcg_ctx, tval, taddr, ctx->mem_idx);
#ifdef TARGET_WORDS_BIGENDIAN
    tcg_gen_extr_i64_tl(tcg_ctx, tmp2, tmp1, tval);
#else
    tcg_gen_extr_i64_tl(tcg_ctx, tmp1, tmp2, tval);
#endif
    gen_store_gpr(tcg_ctx, tmp1, reg1);
    tcg_temp_free(tcg_ctx, tmp1);
    gen_store_gpr(tcg_ctx, tmp2, reg2);
    tcg_temp_free(tcg_ctx, tmp2);
    tcg_gen_st_i64(tcg_ctx, tval, tcg_ctx->cpu_env, offsetof(CPUMIPSState, llval_wp));
    tcg_temp_free_i64(tcg_ctx, tval);
    tcg_gen_st_tl(tcg_ctx, taddr, tcg_ctx->cpu_env, offsetof(CPUMIPSState, lladdr));
    tcg_temp_free(tcg_ctx, taddr);
}